

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O2

Uint64 __thiscall Diligent::FenceVkImpl::GetCompletedValue(FenceVkImpl *this)

{
  VkSemaphore TimelineSemaphore;
  VkResult VVar1;
  Uint64 UVar2;
  Uint64 SemaphoreCounter;
  string msg;
  
  TimelineSemaphore = (this->m_TimelineSemaphore).m_VkObject;
  if (TimelineSemaphore == (VkSemaphore)0x0) {
    std::mutex::lock(&this->m_SyncPointsGuard);
    UVar2 = InternalGetCompletedValue(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SyncPointsGuard);
    SemaphoreCounter = UVar2;
  }
  else {
    SemaphoreCounter = 0xffffffffffffffff;
    VVar1 = VulkanUtilities::VulkanLogicalDevice::GetSemaphoreCounter
                      ((((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                        .m_pDevice)->m_LogicalVkDevice).
                       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,TimelineSemaphore,&SemaphoreCounter);
    if (VVar1 != VK_SUCCESS) {
      FormatString<char[41]>(&msg,(char (*) [41])"Failed to get timeline semaphore counter");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetCompletedValue",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0x75);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return SemaphoreCounter;
}

Assistant:

Uint64 FenceVkImpl::GetCompletedValue()
{
    if (IsTimelineSemaphore())
    {
        // GetSemaphoreCounter() is thread safe

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

        Uint64   SemaphoreCounter = ~Uint64{0};
        VkResult err              = LogicalDevice.GetSemaphoreCounter(m_TimelineSemaphore, &SemaphoreCounter);
        DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to get timeline semaphore counter");
        return SemaphoreCounter;
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};
        return InternalGetCompletedValue();
    }
}